

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest-main.cc
# Opt level: O1

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run(void)

{
  int iVar1;
  undefined8 extraout_RAX;
  FlagSaver fs;
  CommandLineFlagInfo info;
  FlagSaver FStack_1d8;
  undefined1 local_1d0 [32];
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  bool local_110;
  bool bStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined4 *puStack_108;
  undefined1 local_100 [32];
  _Alloc_hider local_e0;
  char local_d0 [16];
  _Alloc_hider local_c0;
  char local_b0 [16];
  _Alloc_hider local_a0;
  char local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  _Alloc_hider local_60;
  char local_50 [24];
  undefined4 *puStack_38;
  
  FlagSaver::FlagSaver(&FStack_1d8);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoOrDieTest","FlagExistsAndIsDefault")
  ;
  local_1d0._0_8_ = local_1d0 + 0x10;
  local_1d0._8_8_ = 0;
  local_1d0[0x10] = '\0';
  local_1b0._M_p = (pointer)&local_1a0;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_190._M_p = (pointer)&local_180;
  local_188 = 0;
  local_180._M_local_buf[0] = '\0';
  local_170._M_p = (pointer)&local_160;
  local_168 = 0;
  local_160._M_local_buf[0] = '\0';
  local_150._M_p = (pointer)&local_140;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  local_130._M_p = (pointer)&local_120;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  GetCommandLineFlagInfoOrDie((CommandLineFlagInfo *)local_100,"test_int32");
  std::__cxx11::string::operator=((string *)local_1d0,(string *)local_100);
  std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_e0);
  std::__cxx11::string::operator=((string *)&local_190,(string *)&local_c0);
  std::__cxx11::string::operator=((string *)&local_170,(string *)&local_a0);
  std::__cxx11::string::operator=((string *)&local_150,(string *)&local_80);
  std::__cxx11::string::operator=((string *)&local_130,(string *)&local_60);
  local_110 = (bool)local_50[0x10];
  bStack_10f = (bool)local_50[0x11];
  uStack_10e = local_50[0x12];
  uStack_10d = local_50[0x13];
  uStack_10c = local_50[0x14];
  uStack_10b = local_50[0x15];
  uStack_10a = local_50[0x16];
  uStack_109 = local_50[0x17];
  puStack_108 = puStack_38;
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  if (local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p);
  }
  if (local_c0._M_p != local_b0) {
    operator_delete(local_c0._M_p);
  }
  if (local_e0._M_p != local_d0) {
    operator_delete(local_e0._M_p);
  }
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_);
  }
  iVar1 = std::__cxx11::string::compare(local_1d0);
  if (iVar1 == 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_1b0);
    if (iVar1 != 0) goto LAB_00138d8f;
    iVar1 = std::__cxx11::string::compare((char *)&local_190);
    if (iVar1 != 0) goto LAB_00138d94;
    iVar1 = std::__cxx11::string::compare((char *)&local_170);
    if (iVar1 != 0) goto LAB_00138d99;
    iVar1 = std::__cxx11::string::compare((char *)&local_150);
    if (iVar1 != 0) goto LAB_00138d9e;
    if (bStack_10f == false) goto LAB_00138da3;
    if (puStack_108 != &fLI::FLAGS_test_int32) goto LAB_00138da8;
    GetCommandLineFlagInfoOrDie((CommandLineFlagInfo *)local_100,"test_bool");
    std::__cxx11::string::operator=((string *)local_1d0,(string *)local_100);
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_e0);
    std::__cxx11::string::operator=((string *)&local_190,(string *)&local_c0);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_a0);
    std::__cxx11::string::operator=((string *)&local_150,(string *)&local_80);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_60);
    local_110 = (bool)local_50[0x10];
    bStack_10f = (bool)local_50[0x11];
    uStack_10e = local_50[0x12];
    uStack_10d = local_50[0x13];
    uStack_10c = local_50[0x14];
    uStack_10b = local_50[0x15];
    uStack_10a = local_50[0x16];
    uStack_109 = local_50[0x17];
    puStack_108 = puStack_38;
    if (local_60._M_p != local_50) {
      operator_delete(local_60._M_p);
    }
    if (local_80._M_p != local_70) {
      operator_delete(local_80._M_p);
    }
    if (local_a0._M_p != local_90) {
      operator_delete(local_a0._M_p);
    }
    if (local_c0._M_p != local_b0) {
      operator_delete(local_c0._M_p);
    }
    if (local_e0._M_p != local_d0) {
      operator_delete(local_e0._M_p);
    }
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_);
    }
    iVar1 = std::__cxx11::string::compare(local_1d0);
    if (iVar1 != 0) goto LAB_00138dad;
    iVar1 = std::__cxx11::string::compare((char *)&local_1b0);
    if (iVar1 != 0) goto LAB_00138db2;
    iVar1 = std::__cxx11::string::compare((char *)&local_190);
    if (iVar1 != 0) goto LAB_00138db7;
    iVar1 = std::__cxx11::string::compare((char *)&local_170);
    if (iVar1 != 0) goto LAB_00138dbc;
    iVar1 = std::__cxx11::string::compare((char *)&local_150);
    if (iVar1 != 0) goto LAB_00138dc1;
    if (bStack_10f == false) goto LAB_00138dc6;
    if (local_110 != true) {
      if (puStack_108 == (undefined4 *)&fLB::FLAGS_test_bool) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_p != &local_120) {
          operator_delete(local_130._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != &local_160) {
          operator_delete(local_170._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_p != &local_180) {
          operator_delete(local_190._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_p != &local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
        FlagSaver::~FlagSaver(&FStack_1d8);
        return;
      }
      goto LAB_00138dd0;
    }
  }
  else {
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138d8f:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138d94:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138d99:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138d9e:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138da3:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138da8:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138dad:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138db2:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138db7:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138dbc:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138dc1:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138dc6:
    _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
  }
  _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
LAB_00138dd0:
  _GLOBAL__N_1::Test_GetCommandLineFlagInfoOrDieTest_FlagExistsAndIsDefault::Run();
  CommandLineFlagInfo::~CommandLineFlagInfo((CommandLineFlagInfo *)local_1d0);
  FlagSaver::~FlagSaver(&FStack_1d8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(GetCommandLineFlagInfoOrDieTest, FlagExistsAndIsDefault) {
  CommandLineFlagInfo info;
  info = GetCommandLineFlagInfoOrDie("test_int32");
  EXPECT_EQ("test_int32", info.name);
  EXPECT_EQ("int32", info.type);
  EXPECT_EQ("", info.description);
  EXPECT_EQ("-1", info.current_value);
  EXPECT_EQ("-1", info.default_value);
  EXPECT_TRUE(info.is_default);
  EXPECT_EQ(&FLAGS_test_int32, info.flag_ptr);
  info = GetCommandLineFlagInfoOrDie("test_bool");
  EXPECT_EQ("test_bool", info.name);
  EXPECT_EQ("bool", info.type);
  EXPECT_EQ("tests bool-ness", info.description);
  EXPECT_EQ("false", info.current_value);
  EXPECT_EQ("false", info.default_value);
  EXPECT_TRUE(info.is_default);
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_bool, info.flag_ptr);
}